

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::WriteLinearConExpr
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *this)

{
  NLHeader *pNVar1;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *in_RDI;
  SingleSparseDblVecWrtFactory vwf;
  int i;
  function<void_(int)> *hdr_prn;
  undefined4 in_stack_ffffffffffffff68;
  int iVar2;
  function<void_(int)> local_68;
  SingleSparseVecWrtFactory<int,_double> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  NLFeeder_Easy *in_stack_ffffffffffffffd0;
  int local_c;
  
  local_c = 0;
  while( true ) {
    iVar2 = local_c;
    pNVar1 = Hdr(in_RDI);
    if ((pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons <= iVar2) break;
    hdr_prn = &local_68;
    std::function<void(int)>::
    function<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::WriteLinearConExpr()::_lambda(int)_1_,void>
              ((function<void_(int)> *)in_RDI,
               (anon_class_16_2_d708298c *)CONCAT44(iVar2,in_stack_ffffffffffffff68));
    SingleSparseVecWrtFactory<int,_double>::SingleSparseVecWrtFactory
              ((SingleSparseVecWrtFactory<int,_double> *)in_RDI,
               (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff68),hdr_prn);
    std::function<void_(int)>::~function((function<void_(int)> *)0x11a085);
    Feeder(in_RDI);
    NLFeeder_Easy::
    FeedLinearConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::SingleSparseVecWrtFactory<int,double>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    SingleSparseVecWrtFactory<int,_double>::~SingleSparseVecWrtFactory
              ((SingleSparseVecWrtFactory<int,_double> *)0x11a0af);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteLinearConExpr() {
  for (int i=0; i<Hdr().num_algebraic_cons; ++i) {
    SingleSparseDblVecWrtFactory
        vwf(*this,
            [i, this](int nnz){
      this->apr(this->nm, "J%d %d\n", i, nnz);
    });
    Feeder().FeedLinearConExpr(i, vwf);
  }
}